

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

ArenaAllocator * __thiscall Js::ScriptContext::AllocatorForDiagnostics(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *alloc;
  ArenaAllocator *this_00;
  ThreadContext *this_01;
  DebugManager *this_02;
  PageAllocator *pageAllocator;
  undefined4 *puVar3;
  TrackAllocData local_38;
  ScriptContext *local_10;
  ScriptContext *this_local;
  
  local_10 = this;
  if (this->diagnosticArena == (ArenaAllocator *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,(type_info *)&Memory::ArenaAllocator::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
               ,0x5d6);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
    this_00 = (ArenaAllocator *)new<Memory::HeapAllocator>(0x80,alloc,0x350bd0);
    this_01 = GetThreadContext(this);
    this_02 = ThreadContext::GetDebugManager(this_01);
    pageAllocator = DebugManager::GetDiagnosticPageAllocator(this_02);
    Memory::ArenaAllocator::ArenaAllocator
              (this_00,L"Diagnostic",pageAllocator,Throw::OutOfMemory,
               JsUtil::ExternalApi::RecoverUnusedMemory);
    this->diagnosticArena = this_00;
  }
  if (this->diagnosticArena == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x5d8,"(this->diagnosticArena != nullptr)",
                                "this->diagnosticArena != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return this->diagnosticArena;
}

Assistant:

ArenaAllocator* ScriptContext::AllocatorForDiagnostics()
    {
        if (this->diagnosticArena == nullptr)
        {
            this->diagnosticArena = HeapNew(ArenaAllocator, _u("Diagnostic"), this->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
        }
        Assert(this->diagnosticArena != nullptr);
        return this->diagnosticArena;
    }